

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prodcons1.c
# Opt level: O0

void * consumer(void *arg)

{
  int iVar1;
  uint local_14;
  int i;
  void *arg_local;
  
  for (local_14 = 0; (int)local_14 < nitems; local_14 = local_14 + 1) {
    iVar1 = sem_wait((sem_t *)shared.nstored);
    if (iVar1 != 0) {
      fprintf(_stderr,"[%s:%d]",
              "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch10/prodcons1.c"
              ,0x4a);
      err_quit("Failed to wait for nstored");
    }
    iVar1 = sem_wait((sem_t *)shared.mutex);
    if (iVar1 != 0) {
      fprintf(_stderr,"[%s:%d]",
              "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch10/prodcons1.c"
              ,0x4b);
      err_quit("Failed to wait for mutex");
    }
    printf("consuming %d at %d\n",(ulong)local_14,(long)(int)local_14 % 10 & 0xffffffff);
    if (shared.buff[(int)local_14 % 10] != local_14) {
      fprintf(_stderr,"[%s:%d]",
              "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch10/prodcons1.c"
              ,0x4e);
      err_sys("buff[%d] = %d, should be %d",(long)(int)local_14 % 10 & 0xffffffff,
              shared.buff[(int)local_14 % 10],local_14);
    }
    iVar1 = sem_post((sem_t *)shared.mutex);
    if (iVar1 != 0) {
      fprintf(_stderr,"[%s:%d]",
              "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch10/prodcons1.c"
              ,0x4f);
      err_quit("Failed to post to mutex");
    }
    iVar1 = sem_post((sem_t *)shared.nempty);
    if (iVar1 != 0) {
      fprintf(_stderr,"[%s:%d]",
              "/workspace/llm4binary/github/license_all_cmakelists_25/pkulijing[P]unix_network_programming_ipc/ch10/prodcons1.c"
              ,0x50);
      err_quit("Failed to post to nempty");
    }
  }
  return (void *)0x0;
}

Assistant:

void * consumer(void * arg) {
  int i;
  for (i = 0; i < nitems; ++i) {
    ASSERT_ERR_QUIT(sem_wait(shared.nstored) == 0, "Failed to wait for nstored");
    ASSERT_ERR_QUIT(sem_wait(shared.mutex) == 0, "Failed to wait for mutex");
    printf("consuming %d at %d\n", i, i % NBUFF);
    ASSERT_ERR_SYS(shared.buff[i % NBUFF] == i, "buff[%d] = %d, should be %d",
      i % NBUFF, shared.buff[i % NBUFF], i);
    ASSERT_ERR_QUIT(sem_post(shared.mutex) == 0, "Failed to post to mutex");
    ASSERT_ERR_QUIT(sem_post(shared.nempty) == 0, "Failed to post to nempty");
  }

  return NULL;
}